

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

char * la_json_pretty_print(char *json_string)

{
  ulong in_RAX;
  _Bool prettify_json;
  undefined8 uStack_8;
  
  uStack_8 = in_RAX & 0xffffffffffffff;
  la_config_get_bool("prettify_json",(_Bool *)((long)&uStack_8 + 7));
  return (char *)0x0;
}

Assistant:

char *la_json_pretty_print(char const *json_string) {
	la_assert(json_string);

	bool prettify_json = false;
	(void)la_config_get_bool("prettify_json", &prettify_json);
	if(prettify_json == false) {
		return NULL;
	}

	char *result = NULL;
#ifdef WITH_JANSSON
	json_error_t err;
	json_t *root = json_loads(json_string, 0, &err);
	if(root) {
		result = json_dumps(root, JSON_INDENT(1) | JSON_REAL_PRECISION(6));
		if(result == NULL) {
			la_debug_print(D_INFO, "json_dumps() did not return any result\n");
		}
	} else {
		la_debug_print(D_ERROR, "Failed to decode JSON string at position %d: %s\n",
				err.position, err.text);
	}
	json_decref(root);
#else
	LA_UNUSED(json_string);
#endif // WITH_JANSSON
	return result;
}